

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_primitives.cpp
# Opt level: O2

string * __thiscall
editor::figures::Rectangle::get_representation_abi_cxx11_
          (string *__return_storage_ptr__,Rectangle *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"rectangle, left top: (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->left_top).x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->left_top).y);
  poVar1 = std::operator<<(poVar1,"), right bottom: (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->right_bottom).x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->right_bottom).y);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Rectangle::get_representation() {
        std::stringstream ss;
        ss << "rectangle, left top: ("
                  << left_top.x << "," << left_top.y << "), right bottom: ("
                  << right_bottom.x << "," << right_bottom.y << ")";
        return ss.str();
    }